

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PrefixUnaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrefixUnaryExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3)

{
  PrefixUnaryExpressionSyntax *pPVar1;
  ExpressionSyntax *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RSI;
  undefined8 in_RDI;
  SyntaxKind kind;
  BumpAllocator *in_R8;
  PrefixUnaryExpressionSyntax *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  kind = (SyntaxKind)((ulong)in_RDI >> 0x20);
  pPVar1 = (PrefixUnaryExpressionSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  slang::syntax::PrefixUnaryExpressionSyntax::PrefixUnaryExpressionSyntax
            (unaff_retaddr,kind,in_stack_00000008,in_RSI,in_RDX);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }